

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O3

void __thiscall
inipp::Ini<wchar_t>::parse
          (Ini<wchar_t> *this,basic_istream<wchar_t,_std::char_traits<wchar_t>_> *is)

{
  size_t *psVar1;
  element_type *peVar2;
  _Alloc_hider _Var3;
  wchar_t wVar4;
  int iVar5;
  list<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *this_00;
  wistream *pwVar6;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Var7;
  _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,std::__cxx11::wstring>,std::_Select1st<std::pair<std::__cxx11::wstring_const,std::__cxx11::wstring>>,std::less<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,std::__cxx11::wstring>>>
  *this_01;
  iterator iVar8;
  _Node *p_Var9;
  long *plVar10;
  locale loc;
  String line;
  String variable;
  String value;
  String section;
  locale local_d0 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_c8;
  key_type local_a8;
  wchar_t *local_88;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_80;
  key_type local_60;
  undefined8 local_40;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_38;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = L'\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = L'\0';
  std::locale::locale(local_d0,"C");
  plVar10 = *(long **)(is + *(long *)(*(long *)is + -0x18) + 0xf0);
  if (plVar10 != (long *)0x0) {
    this_00 = &this->errors;
    do {
      wVar4 = (**(code **)(*plVar10 + 0x50))(plVar10,10);
      pwVar6 = std::getline<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
                         ((wistream *)is,(wstring *)&local_c8,wVar4);
      _Var3._M_p = local_c8._M_dataplus._M_p;
      if (((byte)pwVar6[*(long *)(*(long *)pwVar6 + -0x18) + 0x20] & 5) != 0) goto LAB_0010a9f2;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,__gnu_cxx::__ops::_Iter_pred<inipp::detail::ltrim<wchar_t>(std::__cxx11::wstring&,std::locale_const&)::_lambda(wchar_t)_1_>>
                        (local_c8._M_dataplus._M_p,
                         local_c8._M_dataplus._M_p + local_c8._M_string_length,local_d0);
      std::__cxx11::wstring::erase(&local_c8,_Var3._M_p,_Var7._M_current);
      local_a8._M_dataplus._M_p = local_c8._M_dataplus._M_p + local_c8._M_string_length;
      local_80._M_dataplus._M_p = local_c8._M_dataplus._M_p;
      std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>,__gnu_cxx::__ops::_Iter_pred<inipp::detail::rtrim<wchar_t>(std::__cxx11::wstring&,std::locale_const&)::_lambda(wchar_t)_1_>>
                (&local_88,&local_a8,&local_80,local_d0);
      std::__cxx11::wstring::erase
                (&local_c8,local_88,local_c8._M_dataplus._M_p + local_c8._M_string_length);
      if (local_c8._M_string_length != 0) {
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,__gnu_cxx::__ops::_Iter_pred<inipp::Ini<wchar_t>::parse(std::wistream&)::_lambda(wchar_t)_1_>>
                          (local_c8._M_dataplus._M_p,
                           local_c8._M_dataplus._M_p + local_c8._M_string_length,this);
        _Var3._M_p = local_c8._M_dataplus._M_p;
        peVar2 = (this->format).
                 super___shared_ptr<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar5 = (*peVar2->_vptr_Format[3])(peVar2,(ulong)(uint)*local_c8._M_dataplus._M_p);
        if ((char)iVar5 == '\0') {
          peVar2 = (this->format).
                   super___shared_ptr<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar5 = (**peVar2->_vptr_Format)(peVar2,(ulong)(uint)*_Var3._M_p);
          if ((char)iVar5 == '\0') {
            if ((_Var7._M_current == local_c8._M_dataplus._M_p) ||
               (_Var7._M_current == local_c8._M_dataplus._M_p + local_c8._M_string_length)) {
              p_Var9 = std::__cxx11::
                       list<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
                       _M_create_node<std::__cxx11::wstring_const&>
                                 ((list<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>
                                   *)this_00,&local_c8);
              goto LAB_0010a966;
            }
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::wstring::
            _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                      ((wstring *)&local_a8,local_c8._M_dataplus._M_p,_Var7._M_current);
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            std::__cxx11::wstring::
            _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                      ((wstring *)&local_80,_Var7._M_current + 1,
                       local_c8._M_dataplus._M_p + local_c8._M_string_length);
            local_88 = local_a8._M_dataplus._M_p + local_a8._M_string_length;
            local_38 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                        *)local_a8._M_dataplus._M_p;
            std::
            __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>,__gnu_cxx::__ops::_Iter_pred<inipp::detail::rtrim<wchar_t>(std::__cxx11::wstring&,std::locale_const&)::_lambda(wchar_t)_1_>>
                      (&local_40,&local_88,&local_38,local_d0);
            std::__cxx11::wstring::erase
                      (&local_a8,local_40,local_a8._M_dataplus._M_p + local_a8._M_string_length);
            _Var3._M_p = local_80._M_dataplus._M_p;
            _Var7 = std::
                    __find_if<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,__gnu_cxx::__ops::_Iter_pred<inipp::detail::ltrim<wchar_t>(std::__cxx11::wstring&,std::locale_const&)::_lambda(wchar_t)_1_>>
                              (local_80._M_dataplus._M_p,
                               local_80._M_dataplus._M_p + local_80._M_string_length,local_d0);
            std::__cxx11::wstring::erase(&local_80,_Var3._M_p,_Var7._M_current);
            this_01 = (_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,std::__cxx11::wstring>,std::_Select1st<std::pair<std::__cxx11::wstring_const,std::__cxx11::wstring>>,std::less<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,std::__cxx11::wstring>>>
                       *)std::
                         map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>_>_>
                         ::operator[](&this->sections,&local_60);
            iVar8 = std::
                    _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                            *)this_01,&local_a8);
            if (iVar8._M_node == (_Base_ptr)(this_01 + 8)) {
              std::
              _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,std::__cxx11::wstring>,std::_Select1st<std::pair<std::__cxx11::wstring_const,std::__cxx11::wstring>>,std::less<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,std::__cxx11::wstring>>>
              ::_M_emplace_unique<std::__cxx11::wstring&,std::__cxx11::wstring&>
                        (this_01,&local_a8,&local_80);
            }
            else {
              p_Var9 = std::__cxx11::
                       list<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
                       _M_create_node<std::__cxx11::wstring_const&>
                                 ((list<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>
                                   *)this_00,&local_c8);
              std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
              psVar1 = &(this->errors).
                        super__List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                        ._M_impl._M_node._M_size;
              *psVar1 = *psVar1 + 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,
                              local_80.field_2._M_allocated_capacity * 4 + 4);
            }
          }
          else {
            peVar2 = (this->format).
                     super___shared_ptr<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar5 = (*peVar2->_vptr_Format[1])
                              (peVar2,(ulong)(uint)local_c8._M_dataplus._M_p
                                                   [local_c8._M_string_length - 1]);
            if ((char)iVar5 == '\0') {
              p_Var9 = std::__cxx11::
                       list<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
                       _M_create_node<std::__cxx11::wstring_const&>
                                 ((list<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>
                                   *)this_00,&local_c8);
LAB_0010a966:
              std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
              psVar1 = &(this->errors).
                        super__List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                        ._M_impl._M_node._M_size;
              *psVar1 = *psVar1 + 1;
              goto LAB_0010a9d0;
            }
            std::__cxx11::wstring::substr((ulong)&local_a8,(ulong)&local_c8);
            std::__cxx11::wstring::operator=((wstring *)&local_60,(wstring *)&local_a8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity * 4 + 4
                           );
          }
        }
      }
LAB_0010a9d0:
      plVar10 = *(long **)(is + *(long *)(*(long *)is + -0x18) + 0xf0);
    } while (plVar10 != (long *)0x0);
  }
  std::__throw_bad_cast();
LAB_0010a9f2:
  std::locale::~locale(local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT44(local_60.field_2._M_local_buf[1],local_60.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT44(local_c8.field_2._M_local_buf[1],local_c8.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  return;
}

Assistant:

void parse(std::basic_istream<CharT> & is) {
		String line;
		String section;
		const std::locale loc{"C"};
		while (std::getline(is, line)) {
			detail::ltrim(line, loc);
			detail::rtrim(line, loc);
			const auto length = line.length();
			if (length > 0) {
				const auto pos = std::find_if(line.begin(), line.end(), [this](CharT ch) { return format->is_assign(ch); });
				const auto & front = line.front();
				if (format->is_comment(front)) {
				}
				else if (format->is_section_start(front)) {
					if (format->is_section_end(line.back()))
						section = line.substr(1, length - 2);
					else
						errors.push_back(line);
				}
				else if (pos != line.begin() && pos != line.end()) {
					String variable(line.begin(), pos);
					String value(pos + 1, line.end());
					detail::rtrim(variable, loc);
					detail::ltrim(value, loc);
					auto & sec = sections[section];
					if (sec.find(variable) == sec.end())
						sec.emplace(variable, value);
					else
						errors.push_back(line);
				}
				else {
					errors.push_back(line);
				}
			}
		}
	}